

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::direction(CRuleParser *this)

{
  bool bVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  CRuleParser *local_10;
  CRuleParser *this_local;
  
  if ((this->super_CQualifierParser).token.type == TT_Blank) {
    return;
  }
  this->state = (TState)afterDirection;
  *(undefined8 *)&this->field_0x1e80 = 0;
  local_10 = this;
  if ((this->super_CQualifierParser).token.type == TT_Word) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"r",&local_31);
    bVar1 = CompareNoCase(&(this->super_CQualifierParser).token.word,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    if (bVar1) {
      CFunctionBuilder::SetRightDirection((CFunctionBuilder *)this);
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"l",&local_69);
    bVar1 = CompareNoCase(&(this->super_CQualifierParser).token.word,(string *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (bVar1) {
      return;
    }
  }
  AddToken(this);
  return;
}

Assistant:

void CRuleParser::direction()
{
	if( token.type == TT_Blank ) {
		return;
	}
	state = &CRuleParser::afterDirection;
	if( token.type == TT_Word ) {
		if( CompareNoCase( token.word, RuleRightMatchingDirectionTag ) ) {
			CFunctionBuilder::SetRightDirection();
			return;
		} else if( CompareNoCase( token.word, RuleLeftMatchingDirectionTag ) ) {
			return;
		}
	}
	AddToken();
}